

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

int Sfm_DecPeformDec3(Sfm_Dec_t *p,Abc_Obj_t *pObj)

{
  Vec_Int_t *vMap;
  Sfm_Par_t *pSVar1;
  void **ppvVar2;
  Mio_Gate_t *pGate1;
  Mio_Gate_t *pGate2;
  char *pFans1;
  char *pFans2;
  word wVar3;
  word wVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int (*pSupp_00) [16];
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  word *pwVar14;
  ulong uVar15;
  ulong uVar16;
  word wVar17;
  int iVar18;
  int iVar19;
  word (*pTruth) [4];
  bool bVar20;
  int local_12a4;
  ulong local_12a0;
  uint local_1294;
  int local_1284;
  Mio_Gate_t *local_1278;
  Mio_Gate_t *local_1270;
  char *local_1268;
  char *local_1260;
  timespec ts;
  Vec_Int_t vFanins;
  int nSupp [4];
  word Masks [2] [8];
  int pSupp [4] [16];
  word uTruth [4] [4];
  int pAssump [1000];
  
  pSVar1 = p->pPars;
  bVar20 = true;
  if (pSVar1->fPrintDecs == 0) {
    bVar20 = pSVar1->fVeryVerbose != 0;
  }
  if (pSVar1->fArea != 0) {
    __assert_fail("p->pPars->fArea == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x4b8,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  uVar5 = pSVar1->nDecMax;
  p->DelayMin = 0;
  if (bVar20) {
    printf("\nNode %4d : MFFC %2d\n",(ulong)(uint)p->iTarget,(ulong)(uint)p->nMffc);
  }
  if (4 < p->pPars->nDecMax) {
    __assert_fail("p->pPars->nDecMax <= SFM_DEC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x4be,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  Sfm_ObjSetupSimInfo(pObj);
  (p->vObjDec).nSize = 0;
  vMap = &p->vObjMap;
  uVar8 = 1;
  if (1 < (int)uVar5) {
    uVar8 = (ulong)uVar5;
  }
  local_1294 = 0xffffffff;
  local_12a0 = 0;
  local_1260 = (char *)0x0;
  local_1268 = (char *)0x0;
  local_1270 = (Mio_Gate_t *)0x0;
  local_1278 = (Mio_Gate_t *)0x0;
  iVar18 = 0;
  do {
    if (p->pMit == (Sfm_Mit_t *)0x0) {
      local_12a4 = Sfm_TimReadObjDelay(p->pTim,pObj->Id);
    }
    else {
      local_12a4 = Sfm_MitReadObjDelay(p->pMit,pObj->Id);
    }
    if (iVar18 < (p->vObjDec).nSize) {
      (p->vObjDec).nSize = iVar18;
    }
    uVar5 = p->nPats[0];
    uVar9 = (ulong)uVar5;
    if (0x200 < uVar9) {
LAB_004b2bb7:
      __assert_fail("nBits >= 0 && nBits <= nWords * 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0xc6,"void Abc_TtMask(word *, int, int)");
    }
    pTruth = uTruth + local_12a0;
    iVar18 = (p->vObjDec).nSize + 1;
    uVar13 = uVar9;
    pwVar14 = Masks[0];
    uVar16 = 0;
    do {
      uVar15 = uVar16 + 0x40;
      wVar17 = 0xffffffffffffffff;
      if (uVar9 < uVar15) {
        if (uVar16 < uVar9) {
          if (0x40 < uVar13) goto LAB_004b2b98;
          wVar17 = 0xffffffffffffffff >> (0x40U - (char)uVar5 & 0x3f);
        }
        else {
          wVar17 = 0;
        }
      }
      *pwVar14 = wVar17;
      pwVar14 = pwVar14 + 1;
      uVar13 = uVar13 - 0x40;
      uVar16 = uVar15;
    } while (uVar15 != 0x200);
    uVar5 = p->nPats[1];
    uVar9 = (ulong)uVar5;
    if (0x200 < uVar9) goto LAB_004b2bb7;
    pwVar14 = Masks[1];
    uVar13 = uVar9;
    uVar16 = 0;
    do {
      uVar15 = uVar16 + 0x40;
      wVar17 = 0xffffffffffffffff;
      if (uVar9 < uVar15) {
        if (uVar16 < uVar9) {
          if (0x40 < uVar13) {
LAB_004b2b98:
            __assert_fail("nBits >= 0 && nBits <= 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                          ,0xc2,"word Abc_Tt6Mask(int)");
          }
          wVar17 = 0xffffffffffffffff >> (0x40U - (char)uVar5 & 0x3f);
        }
        else {
          wVar17 = 0;
        }
      }
      *pwVar14 = wVar17;
      pwVar14 = pwVar14 + 1;
      uVar13 = uVar13 - 0x40;
      uVar16 = uVar15;
    } while (uVar15 != 0x200);
    pSupp_00 = pSupp + local_12a0;
    uVar5 = Sfm_DecPeformDec_rec(p,*pTruth,*pSupp_00,pAssump,0,Masks,1,0);
    nSupp[local_12a0] = uVar5;
    if (uVar5 == 0xfffffffe) {
LAB_004b2634:
      if (bVar20) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n",local_12a0,(ulong)(uint)p->nPats[0],
               (ulong)(uint)p->nPats[1]);
      }
    }
    else {
      if (bVar20) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ",local_12a0,(ulong)(uint)p->nPats[0],
               (ulong)(uint)p->nPats[1],(ulong)uVar5);
        Dau_DsdPrintFromTruth(*pTruth,uVar5);
      }
      if ((uVar5 == 1 && p->pTim != (Sfm_Tim_t *)0x0) && ((*pTruth)[0] == 0x5555555555555555)) {
        iVar6 = (*pSupp_00)[0];
        if (((long)iVar6 < 0) || ((p->vObjMap).nSize <= iVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar19 = p->DelayInv;
        iVar6 = (p->vObjMap).pArray[iVar6];
        if (p->pMit == (Sfm_Mit_t *)0x0) {
          iVar6 = Sfm_TimReadObjDelay(p->pTim,iVar6);
        }
        else {
          iVar6 = Sfm_MitReadObjDelay(p->pMit,iVar6);
        }
        if (local_12a4 <= iVar6 + iVar19) goto LAB_004b2634;
      }
      if ((uVar5 == 1 && p->pMit != (Sfm_Mit_t *)0x0) && ((*pTruth)[0] == 0x5555555555555555))
      goto LAB_004b2634;
      if ((int)uVar5 < 2) {
        p->nSuppVars = uVar5;
        wVar17 = (*pTruth)[0];
        wVar3 = uTruth[local_12a0][1];
        wVar4 = uTruth[local_12a0][3];
        p->Copy[2] = uTruth[local_12a0][2];
        p->Copy[3] = wVar4;
        p->Copy[0] = wVar17;
        p->Copy[1] = wVar3;
        iVar18 = Sfm_LibImplementSimple
                           (p->pLib,*pTruth,*pSupp_00,uVar5,&p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < (int)uVar5) {
          __assert_fail("nSupp[i] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                        ,0x4e8,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[(int)uVar5] = p->nLuckySizes[(int)uVar5] + 1;
        if (iVar18 < 3) {
          p->nLuckyGates[iVar18] = p->nLuckyGates[iVar18] + 1;
          return iVar18;
        }
        __assert_fail("RetValue <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                      ,0x4ea,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
      }
      if (p->pMit != (Sfm_Mit_t *)0x0) {
        Sfm_DecPrepareVec(vMap,*pSupp_00,uVar5,&p->vTemp);
        Sfm_DecMffcAreaReal(pObj,&p->vTemp,&p->vTemp3);
      }
      p->nSuppVars = uVar5;
      wVar17 = (*pTruth)[0];
      wVar3 = uTruth[local_12a0][1];
      wVar4 = uTruth[local_12a0][3];
      p->Copy[2] = uTruth[local_12a0][2];
      p->Copy[3] = wVar4;
      p->Copy[0] = wVar17;
      p->Copy[1] = wVar3;
      uVar7 = Sfm_LibFindDelayMatches
                        (p->pLib,*pTruth,*pSupp_00,uVar5,&p->vMatchGates,&p->vMatchFans);
      if (0 < (int)uVar7) {
        lVar12 = 0;
        local_1284 = 0;
        do {
          iVar6 = clock_gettime(3,(timespec *)&ts);
          if (iVar6 < 0) {
            lVar10 = 1;
          }
          else {
            lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          iVar6 = (p->vMatchGates).nSize;
          iVar19 = (int)lVar12;
          if ((((iVar6 <= iVar19) || (iVar6 <= iVar19 + 1)) ||
              (iVar6 = (p->vMatchFans).nSize, iVar6 <= iVar19)) || (iVar6 <= iVar19 + 1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar2 = (p->vMatchGates).pArray;
          pGate1 = (Mio_Gate_t *)ppvVar2[lVar12];
          pGate2 = (Mio_Gate_t *)ppvVar2[lVar12 + 1];
          ppvVar2 = (p->vMatchFans).pArray;
          pFans1 = (char *)ppvVar2[lVar12];
          pFans2 = (char *)ppvVar2[lVar12 + 1];
          vFanins.nCap = uVar5;
          vFanins.nSize = uVar5;
          vFanins.pArray = *pSupp_00;
          if (p->pMit == (Sfm_Mit_t *)0x0) {
            iVar6 = Sfm_TimEvalRemapping(p->pTim,&vFanins,vMap,pGate1,pFans1,pGate2,pFans2);
            if (iVar6 < local_12a4) {
              local_12a4 = iVar6;
              local_1294 = (uint)local_12a0;
              local_1278 = pGate1;
              local_1270 = pGate2;
              local_1268 = pFans1;
              local_1260 = pFans2;
            }
          }
          else {
            iVar6 = Sfm_MitEvalRemapping
                              (p->pMit,&p->vTemp3,pObj,&vFanins,vMap,pGate1,pFans1,pGate2,pFans2);
            if (local_1284 < iVar6) {
              local_1294 = (uint)local_12a0;
              local_1284 = iVar6;
              local_1278 = pGate1;
              local_1270 = pGate2;
              local_1268 = pFans1;
              local_1260 = pFans2;
            }
          }
          iVar6 = clock_gettime(3,(timespec *)&ts);
          if (iVar6 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeEval = p->timeEval + lVar11 + lVar10;
          lVar12 = lVar12 + 2;
        } while ((ulong)uVar7 * 2 != lVar12);
      }
    }
    local_12a0 = local_12a0 + 1;
    if (local_12a0 == uVar8) {
      Sfm_ObjSetdownSimInfo(pObj);
      if (local_1294 == 0xffffffff) {
        if (bVar20) {
          puts("Best  : NO DEC.");
        }
        p->nNoDecs = p->nNoDecs + 1;
        iVar18 = -2;
      }
      else {
        lVar12 = (long)(int)local_1294;
        if (bVar20) {
          printf("Best %d: %d  ",(ulong)local_1294,(ulong)(uint)nSupp[lVar12]);
        }
        iVar18 = Sfm_LibImplementGatesDelay
                           (p->pLib,pSupp[lVar12],local_1278,local_1270,local_1268,local_1260,
                            &p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < nSupp[lVar12]) {
          __assert_fail("nSupp[iBest] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                        ,0x530,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[nSupp[lVar12]] = p->nLuckySizes[nSupp[lVar12]] + 1;
        if (2 < iVar18) {
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                        ,0x532,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckyGates[iVar18] = p->nLuckyGates[iVar18] + 1;
        p->DelayMin = local_12a4;
        iVar18 = 1;
      }
      return iVar18;
    }
  } while( true );
}

Assistant:

int Sfm_DecPeformDec3( Sfm_Dec_t * p, Abc_Obj_t * pObj )
{
    word uTruth[SFM_DEC_MAX][SFM_WORD_MAX], Masks[2][SFM_SIM_WORDS];
    int pSupp[SFM_DEC_MAX][2*SFM_SUPP_MAX];
    int nSupp[SFM_DEC_MAX], pAssump[SFM_WIN_MAX];
    int fVeryVerbose = p->pPars->fPrintDecs || p->pPars->fVeryVerbose;
    int nDecs = Abc_MaxInt(p->pPars->nDecMax, 1);
    int i, k, DelayOrig = 0, DelayMin, GainMax, nMatches, iBest = -1, RetValue, Prev = 0; 
    Mio_Gate_t * pGate1Best = NULL, * pGate2Best = NULL; 
    char * pFans1Best = NULL, * pFans2Best = NULL;
    assert( p->pPars->fArea == 0 );
    p->DelayMin = 0;
    //Sfm_DecPrint( p, NULL );
    if ( fVeryVerbose )
        printf( "\nNode %4d : MFFC %2d\n", p->iTarget, p->nMffc );
    // set limit on search for decompositions in delay-model
    assert( p->pPars->nDecMax <= SFM_DEC_MAX );
    Sfm_ObjSetupSimInfo( pObj );
    Vec_IntClear( &p->vObjDec );
    for ( i = 0; i < nDecs; i++ )
    {
        GainMax = 0;
        DelayMin = DelayOrig = Sfm_ManReadObjDelay( p, Abc_ObjId(pObj) );
        // reduce the variable array
        if ( Vec_IntSize(&p->vObjDec) > Prev )
            Vec_IntShrink( &p->vObjDec, Prev );
        Prev = Vec_IntSize(&p->vObjDec) + 1;
        // perform decomposition 
        Abc_TtMask( Masks[0], SFM_SIM_WORDS, p->nPats[0] );
        Abc_TtMask( Masks[1], SFM_SIM_WORDS, p->nPats[1] );        
        nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], pSupp[i], pAssump, 0, Masks, 1, 0 );
        if ( nSupp[i] == -2 )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( fVeryVerbose )
            printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ", i, p->nPats[0], p->nPats[1], nSupp[i] );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( uTruth[i], nSupp[i] );
        if ( p->pTim && nSupp[i] == 1 && uTruth[i][0] == ABC_CONST(0x5555555555555555) && DelayMin <= p->DelayInv + Sfm_ManReadObjDelay(p, Vec_IntEntry(&p->vObjMap, pSupp[i][0])) )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( p->pMit && nSupp[i] == 1 && uTruth[i][0] == ABC_CONST(0x5555555555555555) )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( nSupp[i] < 2 )
        {
            p->nSuppVars = nSupp[i];
            Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
            RetValue = Sfm_LibImplementSimple( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vObjGates, &p->vObjFanins );
            assert( nSupp[i] <= p->pPars->nVarMax );
            p->nLuckySizes[nSupp[i]]++;
            assert( RetValue <= 2 );
            p->nLuckyGates[RetValue]++;
            return RetValue;
        }

        // get MFFC
        if ( p->pMit )
        {
            Sfm_DecPrepareVec( &p->vObjMap, pSupp[i], nSupp[i], &p->vTemp ); // returns cut in p->vTemp
            Sfm_DecMffcAreaReal(pObj, &p->vTemp, &p->vTemp3 ); // returns MFFC in p->vTemp3
        }

        // try the delay
        p->nSuppVars = nSupp[i];
        Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
        nMatches = Sfm_LibFindDelayMatches( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vMatchGates, &p->vMatchFans );
        for ( k = 0; k < nMatches; k++ )
        {
            abctime clk = Abc_Clock();
            Mio_Gate_t * pGate1 = (Mio_Gate_t *)Vec_PtrEntry( &p->vMatchGates, 2*k+0 );
            Mio_Gate_t * pGate2 = (Mio_Gate_t *)Vec_PtrEntry( &p->vMatchGates, 2*k+1 );
            char * pFans1 = (char *)Vec_PtrEntry( &p->vMatchFans, 2*k+0 );
            char * pFans2 = (char *)Vec_PtrEntry( &p->vMatchFans, 2*k+1 );
            Vec_Int_t vFanins = { nSupp[i], nSupp[i], pSupp[i] };
            // skip identical gate
            //if ( pGate2 == NULL && pGate1 == (Mio_Gate_t *)pObj->pData )
            //    continue;
            if ( p->pMit )
            {
                int Gain = Sfm_MitEvalRemapping( p->pMit, &p->vTemp3, pObj, &vFanins, &p->vObjMap, pGate1, pFans1, pGate2, pFans2 );
                if ( GainMax < Gain )
                {
                    GainMax    = Gain;
                    pGate1Best = pGate1;
                    pGate2Best = pGate2;
                    pFans1Best = pFans1;
                    pFans2Best = pFans2;
                    iBest      = i;
                }
            }
            else
            {
                int Delay = Sfm_TimEvalRemapping( p->pTim, &vFanins, &p->vObjMap, pGate1, pFans1, pGate2, pFans2 );
                if ( DelayMin > Delay )
                {
                    DelayMin   = Delay;
                    pGate1Best = pGate1;
                    pGate2Best = pGate2;
                    pFans1Best = pFans1;
                    pFans2Best = pFans2;
                    iBest      = i;
                }
            }
            p->timeEval += Abc_Clock() - clk;
        }
    }
//printf( "Gain max = %d.\n", GainMax );
    Sfm_ObjSetdownSimInfo( pObj );
    if ( iBest == -1 )
    {
        if ( fVeryVerbose )
            printf( "Best  : NO DEC.\n" );
        p->nNoDecs++;
        return -2;
    }
    if ( fVeryVerbose )
        printf( "Best %d: %d  ", iBest, nSupp[iBest] );
//    if ( fVeryVerbose )
//        Dau_DsdPrintFromTruth( uTruth[iBest], nSupp[iBest] );
    RetValue = Sfm_LibImplementGatesDelay( p->pLib, pSupp[iBest], pGate1Best, pGate2Best, pFans1Best, pFans2Best, &p->vObjGates, &p->vObjFanins );
    assert( nSupp[iBest] <= p->pPars->nVarMax );
    p->nLuckySizes[nSupp[iBest]]++;
    assert( RetValue <= 2 );
    p->nLuckyGates[RetValue]++;
    p->DelayMin = DelayMin;
    return 1;
}